

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

void __thiscall
HighsSparseMatrix::createSlice
          (HighsSparseMatrix *this,HighsSparseMatrix *matrix,HighsInt from_col,HighsInt to_col)

{
  value_type vVar1;
  undefined4 uVar2;
  int iVar3;
  value_type vVar4;
  vector<double,_std::allocator<double>_> *pvVar5;
  vector<double,_std::allocator<double>_> *pvVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  const_reference pvVar10;
  reference pvVar11;
  const_reference pvVar12;
  reference pvVar13;
  int in_ECX;
  vector<int,_std::allocator<int>_> *this_00;
  pointer *this_01;
  int in_EDX;
  long in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  HighsInt iEl;
  HighsInt iCol;
  HighsInt from_col_start;
  HighsInt slice_num_nz;
  HighsInt slice_num_col;
  vector<double,_std::allocator<double>_> *slice_value;
  vector<int,_std::allocator<int>_> *slice_index;
  vector<int,_std::allocator<int>_> *slice_start;
  vector<double,_std::allocator<double>_> *a_value;
  vector<int,_std::allocator<int>_> *a_index;
  vector<int,_std::allocator<int>_> *a_start;
  HighsInt num_row;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int local_64;
  int local_60;
  
  uVar2 = *(undefined4 *)(in_RSI + 8);
  this_00 = (vector<int,_std::allocator<int>_> *)(in_RSI + 0x10);
  this_01 = &(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  pvVar5 = in_RDI + 2;
  pvVar6 = in_RDI + 3;
  iVar7 = (in_ECX + 1) - in_EDX;
  pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)(in_ECX + 1));
  iVar8 = *pvVar10;
  pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)in_EDX);
  iVar8 = iVar8 - *pvVar10;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_RDI,
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)in_RDI,
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  std::vector<double,_std::allocator<double>_>::resize
            (in_RDI,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)in_EDX);
  iVar3 = *pvVar10;
  for (local_60 = in_EDX; local_60 < in_ECX + 1; local_60 = local_60 + 1) {
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)local_60);
    iVar9 = *pvVar10 - iVar3;
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)this_01,(long)(local_60 - in_EDX));
    *pvVar11 = iVar9;
  }
  pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)this_01,(long)iVar7);
  *pvVar11 = iVar8;
  pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)in_EDX);
  local_64 = *pvVar10;
  while( true ) {
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)(in_ECX + 1));
    if (*pvVar10 <= local_64) break;
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)(in_RSI + 0x40),(long)local_64);
    vVar4 = *pvVar10;
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)
                         &(pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(long)(local_64 - iVar3));
    *pvVar11 = vVar4;
    pvVar12 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x58),(long)local_64);
    vVar1 = *pvVar12;
    pvVar13 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)
                         &(pvVar6->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(long)(local_64 - iVar3));
    *pvVar13 = vVar1;
    local_64 = local_64 + 1;
  }
  *(int *)((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start + 4) = iVar7;
  *(undefined4 *)
   &(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = uVar2;
  *(undefined4 *)
   &(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_start = 1;
  return;
}

Assistant:

void HighsSparseMatrix::createSlice(const HighsSparseMatrix& matrix,
                                    const HighsInt from_col,
                                    const HighsInt to_col) {
  assert(matrix.formatOk());
  assert(matrix.isColwise());
  assert(this->formatOk());
  HighsInt num_row = matrix.num_row_;
  const vector<HighsInt>& a_start = matrix.start_;
  const vector<HighsInt>& a_index = matrix.index_;
  const vector<double>& a_value = matrix.value_;
  vector<HighsInt>& slice_start = this->start_;
  vector<HighsInt>& slice_index = this->index_;
  vector<double>& slice_value = this->value_;
  HighsInt slice_num_col = to_col + 1 - from_col;
  HighsInt slice_num_nz = a_start[to_col + 1] - a_start[from_col];
  slice_start.resize(slice_num_col + 1);
  slice_index.resize(slice_num_nz);
  slice_value.resize(slice_num_nz);
  HighsInt from_col_start = a_start[from_col];
  for (HighsInt iCol = from_col; iCol < to_col + 1; iCol++)
    slice_start[iCol - from_col] = a_start[iCol] - from_col_start;
  slice_start[slice_num_col] = slice_num_nz;
  for (HighsInt iEl = a_start[from_col]; iEl < a_start[to_col + 1]; iEl++) {
    slice_index[iEl - from_col_start] = a_index[iEl];
    slice_value[iEl - from_col_start] = a_value[iEl];
  }
  this->num_col_ = slice_num_col;
  this->num_row_ = num_row;
  this->format_ = MatrixFormat::kColwise;
}